

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_xywh.cxx
# Opt level: O1

void Fl::screen_xywh(int *X,int *Y,int *W,int *H,int n)

{
  ulong uVar1;
  
  if (num_screens < 0) {
    screen_init();
  }
  if (0 < num_screens) {
    uVar1 = 0;
    if ((uint)n < (uint)num_screens) {
      uVar1 = (ulong)(uint)n;
    }
    *X = (int)screens[uVar1].x_org;
    *Y = (int)screens[uVar1].y_org;
    *W = (int)screens[uVar1].width;
    *H = (int)screens[uVar1].height;
  }
  return;
}

Assistant:

void Fl::screen_xywh(int &X, int &Y, int &W, int &H, int n) {
  if (num_screens < 0) screen_init();

  if ((n < 0) || (n >= num_screens))
    n = 0;

#ifdef WIN32
  if (num_screens > 0) {
    X = screens[n].left;
    Y = screens[n].top;
    W = screens[n].right - screens[n].left;
    H = screens[n].bottom - screens[n].top;
  } else {
    /* Fallback if something is broken... */
    X = 0;
    Y = 0;
    W = GetSystemMetrics(SM_CXSCREEN);
    H = GetSystemMetrics(SM_CYSCREEN);
  }
#elif defined(__APPLE__)
  X = screens[n].x;
  Y = screens[n].y;
  W = screens[n].width;
  H = screens[n].height;
#else
  if (num_screens > 0) {
    X = screens[n].x_org;
    Y = screens[n].y_org;
    W = screens[n].width;
    H = screens[n].height;
  }
#endif // WIN32
}